

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

bool __thiscall glslang::TInputScanner::consumeComment(TInputScanner *this)

{
  int iVar1;
  bool bVar2;
  int local_1c;
  int c;
  TInputScanner *this_local;
  
  iVar1 = peek(this);
  if (iVar1 == 0x2f) {
    get(this);
    iVar1 = peek(this);
    if (iVar1 == 0x2f) {
      get(this);
      local_1c = get(this);
      while( true ) {
        while( true ) {
          bVar2 = false;
          if (((local_1c != -1) && (bVar2 = false, local_1c != 0x5c)) &&
             (bVar2 = false, local_1c != 0xd)) {
            bVar2 = local_1c != 10;
          }
          if (!bVar2) break;
          local_1c = get(this);
        }
        if (((local_1c == -1) || (local_1c == 0xd)) || (local_1c == 10)) break;
        iVar1 = get(this);
        if ((iVar1 == 0xd) && (iVar1 = peek(this), iVar1 == 10)) {
          get(this);
        }
        local_1c = get(this);
      }
      while (local_1c == 0xd || local_1c == 10) {
        local_1c = get(this);
      }
      if (local_1c != -1) {
        unget(this);
      }
      this_local._7_1_ = true;
    }
    else if (iVar1 == 0x2a) {
      get(this);
      local_1c = get(this);
      do {
        while (local_1c != -1 && local_1c != 0x2a) {
          local_1c = get(this);
        }
      } while ((local_1c == 0x2a) && (local_1c = get(this), local_1c != 0x2f));
      this_local._7_1_ = true;
    }
    else {
      unget(this);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TInputScanner::consumeComment()
{
    if (peek() != '/')
        return false;

    get();  // consume the '/'
    int c = peek();
    if (c == '/') {

        // a '//' style comment
        get();  // consume the second '/'
        c = get();
        do {
            while (c != EndOfInput && c != '\\' && c != '\r' && c != '\n')
                c = get();

            if (c == EndOfInput || c == '\r' || c == '\n') {
                while (c == '\r' || c == '\n')
                    c = get();

                // we reached the end of the comment
                break;
            } else {
                // it's a '\', so we need to keep going, after skipping what's escaped

                // read the skipped character
                c = get();

                // if it's a two-character newline, skip both characters
                if (c == '\r' && peek() == '\n')
                    get();
                c = get();
            }
        } while (true);

        // put back the last non-comment character
        if (c != EndOfInput)
            unget();

        return true;
    } else if (c == '*') {

        // a '/*' style comment
        get();  // consume the '*'
        c = get();
        do {
            while (c != EndOfInput && c != '*')
                c = get();
            if (c == '*') {
                c = get();
                if (c == '/')
                    break;  // end of comment
                // not end of comment
            } else // end of input
                break;
        } while (true);

        return true;
    } else {
        // it's not a comment, put the '/' back
        unget();

        return false;
    }
}